

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  
  iVar3 = 0;
  cVar6 = '\0';
  iVar2 = 1;
switchD_00178790_caseD_4:
  while( true ) {
    iVar5 = iVar2;
    pcVar7 = ptr;
    ptr = pcVar7 + 2;
    bVar1 = pcVar7[2];
    iVar2 = iVar5;
    if (bVar1 == 0) break;
    if (bVar1 - 0xd8 < 4) {
switchD_00178790_caseD_7:
      if ((iVar5 == 0) && (iVar5 = 1, iVar3 < attsMax)) {
        atts[iVar3].name = ptr;
        atts[iVar3].normalized = '\x01';
        iVar5 = 1;
      }
      ptr = pcVar7 + 4;
      iVar2 = iVar5;
    }
    else if (3 < bVar1 - 0xdc) {
      if (bVar1 != 0xff) goto switchD_00178790_caseD_5;
      if ((byte)pcVar7[3] < 0xfe && iVar5 == 0) {
LAB_0017879a:
        iVar2 = 1;
        if (iVar3 < attsMax) {
          atts[iVar3].name = ptr;
          atts[iVar3].normalized = '\x01';
          iVar2 = 1;
        }
      }
    }
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar7[3])) {
  case 3:
    if (iVar3 < attsMax) {
      atts[iVar3].normalized = '\0';
    }
  default:
    goto switchD_00178790_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
switchD_00178790_caseD_5:
    if (iVar5 == 0) goto LAB_0017879a;
    goto switchD_00178790_caseD_4;
  case 6:
    if ((iVar5 == 0) && (iVar5 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = ptr;
      atts[iVar3].normalized = '\x01';
      iVar5 = 1;
    }
    ptr = pcVar7 + 3;
    iVar2 = iVar5;
    goto switchD_00178790_caseD_4;
  case 7:
    goto switchD_00178790_caseD_7;
  case 9:
  case 10:
    iVar2 = 0;
    if (((iVar5 != 1) && (iVar2 = iVar5, iVar5 == 2)) && (iVar2 = 2, iVar3 < attsMax)) {
      atts[iVar3].normalized = '\0';
      iVar2 = 2;
    }
    goto switchD_00178790_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00178790_caseD_b;
  case 0xc:
    if (iVar5 == 2) {
      iVar2 = 2;
      if (cVar6 == '\f') {
        if (iVar3 < attsMax) {
          atts[iVar3].valueEnd = ptr;
        }
        iVar3 = iVar3 + 1;
        cVar6 = '\f';
        iVar2 = 0;
      }
      goto switchD_00178790_caseD_4;
    }
    cVar6 = '\f';
    break;
  case 0xd:
    if (iVar5 == 2) {
      iVar2 = 2;
      if (cVar6 == '\r') {
        if (iVar3 < attsMax) {
          atts[iVar3].valueEnd = ptr;
        }
        iVar3 = iVar3 + 1;
        cVar6 = '\r';
        iVar2 = 0;
      }
      goto switchD_00178790_caseD_4;
    }
    cVar6 = '\r';
    break;
  case 0x15:
    iVar2 = 0;
    if ((((iVar5 != 1) && (iVar2 = iVar5, iVar5 == 2)) && (iVar2 = 2, iVar3 < attsMax)) &&
       (iVar2 = 2, atts[iVar3].normalized != '\0')) {
      if ((ptr != atts[iVar3].valuePtr) && (pcVar7[3] == ' ')) {
        bVar1 = pcVar7[4];
        cVar4 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 - 0xdc < 4) {
            cVar4 = '\b';
          }
          else if (bVar1 == 0xff) {
            cVar4 = '\0';
            if ((byte)pcVar7[5] < 0xfe) goto LAB_001789c6;
          }
          else if (bVar1 == 0) {
            if ((ulong)(byte)pcVar7[5] == 0x20) goto LAB_001789d8;
            cVar4 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar7[5]);
          }
          else {
LAB_001789c6:
            cVar4 = '\x1d';
          }
        }
        iVar2 = 2;
        if (cVar4 != cVar6) goto switchD_00178790_caseD_4;
      }
LAB_001789d8:
      atts[iVar3].normalized = '\0';
      iVar2 = 2;
    }
    goto switchD_00178790_caseD_4;
  }
  iVar2 = 2;
  if (iVar3 < attsMax) {
    atts[iVar3].valuePtr = pcVar7 + 4;
    iVar2 = 2;
  }
  goto switchD_00178790_caseD_4;
switchD_00178790_caseD_b:
  iVar2 = 2;
  if (iVar5 != 2) {
    return iVar3;
  }
  goto switchD_00178790_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr, int attsMax,
                ATTRIBUTE *atts) {
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define START_NAME                                                           \
    if (state == other) {                                                      \
      if (nAtts < attsMax) {                                                   \
        atts[nAtts].name = ptr;                                                \
        atts[nAtts].normalized = 1;                                            \
      }                                                                        \
      state = inName;                                                          \
    }
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n: /* NOTE: The encoding has already been validated. */        \
    START_NAME ptr += (n - MINBPC(enc));                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#  undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      } else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      } else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR:
    case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}